

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextUpdateUndocking(ImGuiContext *ctx)

{
  ImGuiDockContext *pIVar1;
  ImGuiID *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiDockNode *src_node;
  ImGuiWindow *window;
  ImGuiDockNode *pIVar4;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  ImGuiContext *in_RSI;
  int n_1;
  int n_2;
  long lVar5;
  int n;
  long lVar6;
  bool bVar7;
  
  pIVar1 = ctx->DockContext;
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (pIVar1->Nodes).Data.Size) || (0 < (pIVar1->Requests).Size)) {
      DockContextClearNodes((ImGuiContext *)0x1,(ImGuiID)in_RSI,SUB81(in_RDX,0));
      return;
    }
  }
  else {
    if ((ctx->IO).ConfigDockingNoSplit == true) {
      lVar5 = 8;
      for (lVar6 = 0; lVar6 < (pIVar1->Nodes).Data.Size; lVar6 = lVar6 + 1) {
        pIVar2 = *(ImGuiID **)((long)&((pIVar1->Nodes).Data.Data)->key + lVar5);
        if (((pIVar2 != (ImGuiID *)0x0) && (*(long *)(pIVar2 + 4) == 0)) &&
           (*(long *)(pIVar2 + 6) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar2);
          in_RDX = extraout_RDX;
        }
        lVar5 = lVar5 + 0x10;
      }
    }
    if (pIVar1->WantFullRebuild == true) {
      DockContextRebuildNodes((ImGui *)ctx,in_RSI);
      pIVar1->WantFullRebuild = false;
      in_RDX = extraout_RDX_00;
    }
    for (lVar5 = 0; lVar5 < (pIVar1->Requests).Size; lVar5 = lVar5 + 1) {
      pIVar3 = (pIVar1->Requests).Data;
      if (pIVar3[lVar5].Type == ImGuiDockRequestType_Undock) {
        if ((ImGuiContext *)pIVar3[lVar5].UndockTargetWindow == (ImGuiContext *)0x0) {
          src_node = pIVar3[lVar5].UndockTargetNode;
          if (src_node != (ImGuiDockNode *)0x0) {
            pIVar4 = src_node->ParentNode;
            if ((pIVar4 == (ImGuiDockNode *)0x0) || ((src_node->LocalFlags & 0x800) != 0)) {
              pIVar4 = DockContextAddNode(ctx,0);
              DockNodeMoveWindows(pIVar4,src_node);
              DockSettingsRenameNodeReferences(src_node->ID,pIVar4->ID);
              in_RDX = extraout_RDX_02;
              for (lVar6 = 0; lVar6 < (pIVar4->Windows).Size; lVar6 = lVar6 + 1) {
                window = (pIVar4->Windows).Data[lVar6];
                UpdateWindowParentAndRootLinks(window,window->Flags,(ImGuiWindow *)0x0);
                in_RDX = extraout_RDX_03;
              }
            }
            else {
              bVar7 = pIVar4->ChildNodes[0] == src_node;
              pIVar4->ChildNodes[!bVar7] = (ImGuiDockNode *)0x0;
              DockNodeTreeMerge(ctx,src_node->ParentNode,src_node->ParentNode->ChildNodes[bVar7]);
              in_RDX = 0xfffffe3f;
              *(ushort *)&src_node->ParentNode->field_0xb0 =
                   (ushort)*(undefined4 *)&src_node->ParentNode->field_0xb0 & 0xfe3f | 0x80;
              src_node->ParentNode = (ImGuiDockNode *)0x0;
              pIVar4 = src_node;
            }
            *(ushort *)&pIVar4->field_0xb0 =
                 (ushort)*(undefined4 *)&pIVar4->field_0xb0 & 0xffc0 | 0x12;
            pIVar4->field_0xb2 = pIVar4->field_0xb2 | 1;
            if (GImGui->SettingsDirtyTimer <= 0.0) {
              GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
            }
          }
        }
        else {
          DockContextProcessUndockWindow
                    ((ImGuiContext *)pIVar3[lVar5].UndockTargetWindow,(ImGuiWindow *)0x1,
                     SUB81(in_RDX,0));
          in_RDX = extraout_RDX_01;
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}